

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

ngx_int_t ngx_atofp(u_char *line,size_t n,size_t point)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  
  if (n == 0) {
    return -1;
  }
  sVar3 = 0;
  lVar4 = 0;
  lVar2 = 0;
  do {
    if (point == 0) {
      return -1;
    }
    bVar1 = line[sVar3];
    if ((ulong)bVar1 == 0x2e) {
      bVar5 = lVar4 != 0;
      lVar4 = 1;
      if (bVar5) {
        return -1;
      }
    }
    else {
      if ((byte)(bVar1 - 0x3a) < 0xf6) {
        return -1;
      }
      if (0xccccccccccccccb < lVar2) {
        if (lVar2 != 0xccccccccccccccc) {
          return -1;
        }
        if ((bVar1 & 8) != 0) {
          return -1;
        }
      }
      lVar2 = (ulong)bVar1 + lVar2 * 10 + -0x30;
      point = point - lVar4;
    }
    sVar3 = sVar3 + 1;
    if (n == sVar3) {
      while( true ) {
        if (point == 0) {
          return lVar2;
        }
        if (0xccccccccccccccc < lVar2) break;
        lVar2 = lVar2 * 10;
        point = point - 1;
      }
      return -1;
    }
  } while( true );
}

Assistant:

ngx_int_t
ngx_atofp(u_char *line, size_t n, size_t point)
{
    ngx_int_t   value, cutoff, cutlim;
    ngx_uint_t  dot;

    if (n == 0) {
        return NGX_ERROR;
    }

    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;

    dot = 0;

    for (value = 0; n--; line++) {

        if (point == 0) {
            return NGX_ERROR;
        }

        if (*line == '.') {
            if (dot) {
                return NGX_ERROR;
            }

            dot = 1;
            continue;
        }

        if (*line < '0' || *line > '9') {
            return NGX_ERROR;
        }

        if (value >= cutoff && (value > cutoff || *line - '0' > cutlim)) {
            return NGX_ERROR;
        }

        value = value * 10 + (*line - '0');
        point -= dot;
    }

    while (point--) {
        if (value > cutoff) {
            return NGX_ERROR;
        }

        value = value * 10;
    }

    return value;
}